

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solve_problem<baryonyx::itm::solver_inequalities_Zcoeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  double cost_constant;
  long lVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ulong uVar5;
  int n;
  random_engine rng;
  default_cost_type<double> cost;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
  slv;
  random_engine local_188;
  default_cost_type<double> local_180;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_170;
  result local_158;
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> local_a8;
  solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
  local_88;
  
  if (*(long *)(this + 0x128) != 0) {
    (**(code **)(this + 0x130))(this + 0x118,this);
  }
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  lVar1 = (ctx->parameters).limit;
  lVar2 = *(long *)&(ctx->parameters).seed;
  make_merged_constraints(&local_170,(context *)this,(problem *)ctx);
  n = (int)((ulong)(lVar1 - lVar2) >> 2) * -0x55555555;
  if ((local_170.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_170.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (lVar1._0_4_ = (ctx->parameters).seed, lVar1._4_4_ = (ctx->parameters).thread,
     lVar1 == (ctx->parameters).limit)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (ctx->parameters).pushing_objective_amplifier;
  }
  else {
    uVar5 = std::chrono::_V2::system_clock::now();
    if ((ulong)*(uint *)(this + 0xa8) != 0) {
      uVar5 = (ulong)*(uint *)(this + 0xa8);
    }
    local_188._M_x = uVar5 % 0x7fffffff + (ulong)(uVar5 % 0x7fffffff == 0);
    default_cost_type<double>::default_cost_type
              (&local_180,(objective_function *)&(ctx->parameters).delta,n);
    cost_constant = (ctx->parameters).pushing_objective_amplifier;
    local_88.m_ctx = (context *)this;
    if (*(int *)(this + 0xe4) == 1) {
      local_88.m_begin.__d.__r = (duration)0;
      local_88.m_end.__d.__r = (duration)0;
      local_88.m_best.x.super_bit_array_impl.m_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_block_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      local_88.m_best.value = -INFINITY;
      local_88.m_best.duration = 0.0;
      local_88.m_best.hash = 0;
      local_88.m_best.loop = 0;
      local_88.m_best.remaining_constraints = 0x7fffffff;
      local_88.m_rng = &local_188;
      solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
      ::operator()(&local_158,
                   (solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
                    *)&local_88,&local_170,n,&local_180,cost_constant);
    }
    else if (*(int *)(this + 0xe4) == 2) {
      local_88.m_begin.__d.__r = (duration)0;
      local_88.m_end.__d.__r = (duration)0;
      local_88.m_best.x.super_bit_array_impl.m_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_block_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      local_88.m_best.value = -INFINITY;
      local_88.m_best.duration = 0.0;
      local_88.m_best.hash = 0;
      local_88.m_best.loop = 0;
      local_88.m_best.remaining_constraints = 0x7fffffff;
      local_88.m_rng = &local_188;
      solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
      ::operator()(&local_158,&local_88,&local_170,n,&local_180,cost_constant);
    }
    else {
      local_88.m_begin.__d.__r = (duration)0;
      local_88.m_end.__d.__r = (duration)0;
      local_88.m_best.x.super_bit_array_impl.m_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_block_size = 0;
      local_88.m_best.x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
           (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
      local_88.m_best.value = -INFINITY;
      local_88.m_best.duration = 0.0;
      local_88.m_best.hash = 0;
      local_88.m_best.loop = 0;
      local_88.m_best.remaining_constraints = 0x7fffffff;
      local_88.m_rng = &local_188;
      solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
      ::operator()(&local_158,
                   (solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
                    *)&local_88,&local_170,n,&local_180,cost_constant);
    }
    _Var4._M_pi = local_158.strings.
                  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar3 = local_158.strings.
             super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_158.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_158.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (__return_storage_ptr__->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (__return_storage_ptr__->method)._M_len = local_158.method._M_len;
    (__return_storage_ptr__->method)._M_str = local_158.method._M_str;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_move_assign(&(__return_storage_ptr__->affected_vars).names);
    std::vector<signed_char,_std::allocator<signed_char>_>::_M_move_assign
              (&(__return_storage_ptr__->affected_vars).values,&local_158.affected_vars.values);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::_M_move_assign(&__return_storage_ptr__->variable_name,&local_158.variable_name);
    local_a8.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start =
         (__return_storage_ptr__->solutions).
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (__return_storage_ptr__->solutions).
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->solutions).
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_158.solutions.
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_158.solutions.
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_158.solutions.
         super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_158.solutions.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.solutions.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.solutions.super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector(&local_a8);
    __return_storage_ptr__->status = local_158.status;
    __return_storage_ptr__->duration = local_158.duration;
    __return_storage_ptr__->loop = local_158.loop;
    __return_storage_ptr__->variables = local_158.variables;
    __return_storage_ptr__->constraints = local_158.constraints;
    __return_storage_ptr__->remaining_constraints = local_158.remaining_constraints;
    __return_storage_ptr__->annoying_variable = local_158.annoying_variable;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector
              (&local_158.solutions);
    if (local_158.variable_name.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.variable_name.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_158.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.variable_name.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158.affected_vars.values.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.affected_vars.values.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.affected_vars.values.
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_158.affected_vars.names.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.affected_vars.names.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_158.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.affected_vars.names.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.strings.
                 super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if ((_Head_base<0UL,_unsigned_long_*,_false>)
        local_88.m_best.x.super_bit_array_impl.m_data._M_t.
        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
        (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
      operator_delete__((void *)local_88.m_best.x.super_bit_array_impl.m_data._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    }
    if (local_180.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
        ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
        super__Head_base<0UL,_double_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
      operator_delete__((void *)local_180.linear_elements._M_t.
                                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                super__Head_base<0UL,_double_*,_false>._M_head_impl);
    }
  }
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(ctx->parameters).time_limit;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__return_storage_ptr__->strings).
              super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(ctx->parameters).theta);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&__return_storage_ptr__->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).init_kappa_improve_increase);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->affected_vars).names,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).pushing_iteration_limit);
  std::vector<signed_char,_std::allocator<signed_char>_>::operator=
            (&(__return_storage_ptr__->affected_vars).values,
             (vector<signed_char,_std::allocator<signed_char>_> *)&(ctx->parameters).cost_norm);
  __return_storage_ptr__->variables = n;
  __return_storage_ptr__->constraints =
       (int)((ulong)((long)local_170.
                           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_170.
                          super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  if (*(long *)(this + 0x168) != 0) {
    (**(code **)(this + 0x170))(this + 0x158,__return_storage_ptr__);
  }
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(&local_170);
  return __return_storage_ptr__;
}

Assistant:

inline result
solve_problem(const context& ctx, const problem& pb)
{
    if (ctx.start)
        ctx.start(ctx.parameters);

    result ret;

    auto variables = length(pb.vars.values);
    auto constraints{ make_merged_constraints(ctx, pb) };

    if (!constraints.empty() && !pb.vars.values.empty()) {
        random_engine rng(init_random_generator_seed(ctx));

        auto cost = Cost(pb.objective, variables);
        auto cost_constant = pb.objective.value;

        switch (ctx.parameters.observer) {
        case solver_parameters::observer_type::pnm: {
            using obs = pnm_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        case solver_parameters::observer_type::file: {
            using obs = file_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        default: {
            using obs = none_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
            break;
        }
        }
    } else {
        ret.status = result_status::success;
        ret.solutions.resize(1);
        ret.solutions.back().value = pb.objective.value;
    }

    ret.strings = pb.strings;
    ret.variable_name = std::move(pb.vars.names);
    ret.affected_vars = std::move(pb.affected_vars);
    ret.variables = variables;
    ret.constraints = length(constraints);

    if (ctx.finish)
        ctx.finish(ret);

    return ret;
}